

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

_Bool do_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event,ALLEGRO_TIMEOUT *timeout
                       )

{
  uint uVar1;
  _Bool _Var2;
  ALLEGRO_EVENT *dest;
  _AL_COND *in_RDX;
  long in_RSI;
  ALLEGRO_EVENT_QUEUE *in_RDI;
  int result;
  ALLEGRO_EVENT *next_event;
  _Bool timed_out;
  uint in_stack_ffffffffffffffc8;
  int iVar3;
  ALLEGRO_TIMEOUT *timeout_00;
  undefined7 in_stack_ffffffffffffffd8;
  byte bVar4;
  
  bVar4 = 0;
  timeout_00 = (ALLEGRO_TIMEOUT *)0x0;
  _al_mutex_lock((_AL_MUTEX *)0x1748ef);
  iVar3 = 0;
  while( true ) {
    _Var2 = is_event_queue_empty(in_RDI);
    uVar1 = in_stack_ffffffffffffffc8 & 0xffffff;
    if (_Var2) {
      uVar1 = CONCAT13(iVar3 != -1,(int3)in_stack_ffffffffffffffc8);
    }
    in_stack_ffffffffffffffc8 = uVar1;
    if ((char)(in_stack_ffffffffffffffc8 >> 0x18) == '\0') break;
    iVar3 = _al_cond_timedwait(in_RDX,(_AL_MUTEX *)CONCAT17(bVar4,in_stack_ffffffffffffffd8),
                               timeout_00);
  }
  if (iVar3 == -1) {
    bVar4 = 1;
  }
  else if (in_RSI != 0) {
    dest = get_next_event_if_any
                     ((ALLEGRO_EVENT_QUEUE *)CONCAT17(bVar4,in_stack_ffffffffffffffd8),
                      SUB81((ulong)timeout_00 >> 0x38,0));
    copy_event(dest,(ALLEGRO_EVENT *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
  }
  _al_mutex_unlock((_AL_MUTEX *)0x174994);
  return (bVar4 & 1) == 0;
}

Assistant:

static bool do_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT *ret_event, ALLEGRO_TIMEOUT *timeout)
{
   bool timed_out = false;
   ALLEGRO_EVENT *next_event = NULL;

   _al_mutex_lock(&queue->mutex);
   {
      int result = 0;

      /* Is the queue is non-empty?  If not, block on a condition
       * variable, which will be signaled when an event is placed into
       * the queue.
       */
      while (is_event_queue_empty(queue) && (result != -1)) {
         result = _al_cond_timedwait(&queue->cond, &queue->mutex, timeout);
      }

      if (result == -1)
         timed_out = true;
      else if (ret_event) {
         next_event = get_next_event_if_any(queue, true);
         copy_event(ret_event, next_event);
      }
   }
   _al_mutex_unlock(&queue->mutex);

   if (timed_out)
      return false;

   return true;
}